

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode create_conn(Curl_easy *data,connectdata **in_connect,_Bool *async)

{
  curl_llist *l;
  undefined1 *puVar1;
  urlpieces *part;
  char **ppcVar2;
  ssl_primary_config *dest;
  ssl_primary_config *dest_00;
  char cVar3;
  curl_proxytype cVar4;
  ssl_connection_state sVar5;
  Curl_easy *data_00;
  curl_slist *pcVar6;
  conncache *pcVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  void *pvVar12;
  bool bVar13;
  bool bVar14;
  hostname *phVar15;
  size_t sVar16;
  bool bVar17;
  _Bool _Var18;
  unsigned_short uVar19;
  CURLUcode CVar20;
  int iVar21;
  CURLcode CVar22;
  CURLcode CVar23;
  curlntlm cVar24;
  size_t sVar25;
  size_t sVar26;
  connectdata *conn;
  ssl_backend_data *psVar27;
  char *pcVar28;
  CURLU *pCVar29;
  Curl_handler *pCVar30;
  size_t sVar31;
  ulong uVar32;
  char **passwordp;
  byte *pbVar33;
  long lVar34;
  timediff_t tVar35;
  size_t sVar36;
  connectbundle *pcVar37;
  connectdata *pcVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  char *pcVar42;
  byte bVar43;
  uint uVar46;
  byte bVar44;
  byte bVar45;
  byte *pbVar47;
  curl_llist_element *pcVar48;
  byte bVar49;
  size_t sVar50;
  char *pcVar51;
  byte *__s;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  curltime cVar56;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  connectdata *local_2f8;
  char *local_2f0;
  byte *local_2e8;
  char *local_2e0;
  CURLcode local_2d4;
  size_t local_2d0;
  ulong local_2a8;
  connectdata *local_298;
  char *zoneid;
  connectdata *local_230;
  undefined1 local_139;
  char *local_138 [31];
  undefined1 local_39;
  
  sVar25 = Curl_multi_max_host_connections(data->multi);
  sVar26 = Curl_multi_max_total_connections(data->multi);
  *async = false;
  *in_connect = (connectdata *)0x0;
  if ((data->change).url == (char *)0x0) {
    return CURLE_URL_MALFORMAT;
  }
  conn = (connectdata *)(*Curl_ccalloc)(1,0x630);
  if (conn == (connectdata *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  sVar36 = Curl_ssl->sizeof_ssl_backend_data;
  psVar27 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar36);
  if (psVar27 == (ssl_backend_data *)0x0) {
    (*Curl_cfree)(conn);
    return CURLE_OUT_OF_MEMORY;
  }
  conn->ssl_extra = psVar27;
  conn->ssl[0].backend = psVar27;
  conn->ssl[1].backend = (ssl_backend_data *)((psVar27->tap_state).master_key + (sVar36 - 0x1c));
  conn->proxy_ssl[0].backend =
       (ssl_backend_data *)((psVar27->tap_state).master_key + sVar36 * 2 + -0x1c);
  conn->proxy_ssl[1].backend =
       (ssl_backend_data *)((psVar27->tap_state).master_key + sVar36 * 3 + -0x1c);
  conn->handler = &Curl_handler_dummy;
  conn->connection_id = -1;
  conn->port = -1;
  conn->remote_port = -1;
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->tempsock[0] = -1;
  conn->tempsock[1] = -1;
  Curl_conncontrol(conn,1);
  cVar56 = Curl_now();
  (conn->created).tv_sec = cVar56.tv_sec;
  (conn->created).tv_usec = cVar56.tv_usec;
  cVar56 = Curl_now();
  (conn->keepalive).tv_sec = cVar56.tv_sec;
  (conn->keepalive).tv_usec = cVar56.tv_usec;
  conn->upkeep_interval_ms = (data->set).upkeep_interval_ms;
  conn->data = data;
  cVar4 = (data->set).proxytype;
  (conn->http_proxy).proxytype = cVar4;
  (conn->socks_proxy).proxytype = CURLPROXY_SOCKS4;
  pcVar28 = (data->set).str[0x15];
  uVar39 = 0;
  if (pcVar28 == (char *)0x0) {
    uVar40 = 0;
    uVar46 = 0;
  }
  else {
    uVar40 = 0;
    uVar46 = 0;
    uVar39 = 0;
    if (*pcVar28 != '\0') {
      uVar40 = 0x10;
      uVar39 = (uint)(cVar4 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) << 5;
      uVar46 = (uint)(cVar4 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) << 6 ^ 0x40;
    }
  }
  uVar39 = *(uint *)&(conn->bits).field_0x4 & 0xffffff8f | uVar39 | uVar40 | uVar46;
  *(uint *)&(conn->bits).field_0x4 = uVar39;
  pcVar28 = (data->set).str[0x16];
  if ((pcVar28 != (char *)0x0) && (*pcVar28 != '\0')) {
    uVar39 = uVar39 | 0x50;
    *(uint *)&(conn->bits).field_0x4 = uVar39;
  }
  uVar40 = (uint)((data->set).str[0x2f] != (char *)0x0) << 8;
  *(uint *)&(conn->bits).field_0x4 = uVar39 & 0xfffffeff | uVar40;
  uVar46 = (*(uint *)&(data->set).field_0x878 & 0x400) << 4;
  *(uint *)&(conn->bits).field_0x4 = uVar39 & 0xffffbeff | uVar40 | uVar46;
  uVar41 = (uint)((data->set).str[0x2c] != (char *)0x0) << 7;
  *(uint *)&(conn->bits).field_0x4 = uVar39 & 0xffffbe7f | uVar40 | uVar46 | uVar41;
  uVar39 = (uVar39 & 0xfffdbe7f | uVar40 | uVar46 | uVar41) +
           (*(uint *)&(data->set).field_0x878 & 0x8000) * 4;
  *(uint *)&(conn->bits).field_0x4 = uVar39;
  uVar39 = (uVar39 & 0xfffbffff) + (*(uint *)&(data->set).field_0x878 & 0x10000) * 4;
  *(uint *)&(conn->bits).field_0x4 = uVar39;
  bVar43 = (data->set).ssl.primary.field_0x48 & 4;
  bVar45 = (conn->ssl_config).field_0x48;
  bVar49 = (conn->proxy_ssl_config).field_0x48;
  (conn->ssl_config).field_0x48 = bVar45 & 0xfb | bVar43;
  bVar44 = (data->set).ssl.primary.field_0x48 & 1;
  (conn->ssl_config).field_0x48 = bVar45 & 0xfa | bVar43 | bVar44;
  (conn->ssl_config).field_0x48 =
       bVar45 & 0xf8 | bVar43 | bVar44 | (data->set).ssl.primary.field_0x48 & 2;
  bVar45 = (data->set).proxy_ssl.primary.field_0x48 & 4;
  (conn->proxy_ssl_config).field_0x48 = bVar49 & 0xfb | bVar45;
  bVar43 = (data->set).proxy_ssl.primary.field_0x48 & 1;
  (conn->proxy_ssl_config).field_0x48 = bVar49 & 0xfa | bVar45 | bVar43;
  (conn->proxy_ssl_config).field_0x48 =
       bVar49 & 0xf8 | bVar45 | bVar43 | (data->set).proxy_ssl.primary.field_0x48 & 2;
  conn->ip_version = (data->set).ipver;
  *(uint *)&(conn->bits).field_0x4 =
       uVar39 & 0x7fffffff | (uint)(*(ulong *)&(data->set).field_0x878 >> 6) & 0x80000000;
  l = &conn->easyq;
  Curl_llist_init(l,llist_dtor);
  pcVar28 = (data->set).str[8];
  if (pcVar28 != (char *)0x0) {
    pcVar28 = (*Curl_cstrdup)(pcVar28);
    conn->localdev = pcVar28;
    if (pcVar28 == (char *)0x0) {
      Curl_llist_destroy(l,(void *)0x0);
      (*Curl_cfree)(conn->localdev);
      (*Curl_cfree)(conn->ssl_extra);
      (*Curl_cfree)(conn);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar12 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar12;
  *in_connect = conn;
  up_free(data);
  pCVar29 = (data->set).uh;
  if (pCVar29 == (CURLU *)0x0) {
    pCVar29 = curl_url();
  }
  else {
    pCVar29 = curl_url_dup(pCVar29);
  }
  (data->state).uh = pCVar29;
  if (pCVar29 == (CURLU *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if (((data->set).str[7] != (char *)0x0) &&
     (_Var18 = Curl_is_absolute_url((data->change).url,(char *)0x0,0x28), !_Var18)) {
    if (((data->change).field_0x20 & 1) != 0) {
      (*Curl_cfree)((data->change).url);
    }
    pcVar28 = curl_maprintf("%s://%s",(data->set).str[7],(data->change).url);
    if (pcVar28 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (data->change).url = pcVar28;
    puVar1 = &(data->change).field_0x20;
    *puVar1 = *puVar1 | 1;
  }
  if ((data->set).uh == (CURLU *)0x0) {
    uVar39 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x878 >> 0x20);
    CVar20 = curl_url_set(pCVar29,CURLUPART_URL,(data->change).url,
                          (uVar39 >> 0x11 & 0x20) + (uVar39 >> 0xb & 0x10) + 0x208);
    switch(CVar20) {
    case CURLUE_OK:
      break;
    default:
      return CURLE_URL_MALFORMAT;
    case CURLUE_UNSUPPORTED_SCHEME:
      return CURLE_UNSUPPORTED_PROTOCOL;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_003cc599_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_003cc599_caseD_8;
    }
  }
  part = &(data->state).up;
  CVar20 = curl_url_get(pCVar29,CURLUPART_SCHEME,&part->scheme,0);
  switch(CVar20) {
  case CURLUE_OK:
    pcVar28 = part->scheme;
    pCVar30 = Curl_builtin_scheme(pcVar28);
    if (((pCVar30 == (Curl_handler *)0x0) ||
        (((uint)(data->set).allowed_protocols & pCVar30->protocol) == 0)) ||
       ((((data->state).field_0x4e4 & 2) != 0 &&
        (((uint)(data->set).redir_protocols & pCVar30->protocol) == 0)))) {
      Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar28);
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    conn->given = pCVar30;
    conn->handler = pCVar30;
    ppcVar2 = &(data->state).up.user;
    CVar20 = curl_url_get(pCVar29,CURLUPART_USER,ppcVar2,0x40);
    switch(CVar20) {
    case CURLUE_OK:
      pcVar28 = (*Curl_cstrdup)(*ppcVar2);
      conn->user = pcVar28;
      if (pcVar28 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      puVar1 = &(conn->bits).field_0x4;
      *puVar1 = *puVar1 | 0x80;
      break;
    default:
      return CURLE_URL_MALFORMAT;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_003cc599_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_003cc599_caseD_8;
    case CURLUE_NO_USER:
      break;
    }
    ppcVar2 = &(data->state).up.password;
    CVar20 = curl_url_get(pCVar29,CURLUPART_PASSWORD,ppcVar2,0x40);
    switch(CVar20) {
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_003cc599_caseD_5;
    case CURLUE_URLDECODE:
    case CURLUE_UNKNOWN_PART:
    case CURLUE_NO_SCHEME:
    case CURLUE_NO_USER:
      goto switchD_003cc675_caseD_6;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_003cc599_caseD_8;
    case CURLUE_NO_PASSWORD:
      break;
    default:
      if (CVar20 != CURLUE_OK) {
        return CURLE_URL_MALFORMAT;
      }
      pcVar28 = (*Curl_cstrdup)(*ppcVar2);
      conn->passwd = pcVar28;
      if (pcVar28 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      puVar1 = &(conn->bits).field_0x4;
      *puVar1 = *puVar1 | 0x80;
    }
    ppcVar2 = &(data->state).up.options;
    CVar20 = curl_url_get(pCVar29,CURLUPART_OPTIONS,ppcVar2,0x40);
    switch(CVar20) {
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_003cc599_caseD_5;
    case CURLUE_URLDECODE:
    case CURLUE_UNKNOWN_PART:
    case CURLUE_NO_SCHEME:
    case CURLUE_NO_USER:
    case CURLUE_NO_PASSWORD:
switchD_003cc675_caseD_6:
      return CURLE_URL_MALFORMAT;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_003cc599_caseD_8;
    default:
      if (CVar20 != CURLUE_OK) {
        return CURLE_URL_MALFORMAT;
      }
      pcVar28 = (*Curl_cstrdup)(*ppcVar2);
      conn->options = pcVar28;
      if (pcVar28 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    case CURLUE_NO_OPTIONS:
      CVar20 = curl_url_get(pCVar29,CURLUPART_HOST,&(data->state).up.hostname,0);
      if ((CVar20 != CURLUE_OK) && (iVar21 = Curl_strcasecompare("file",part->scheme), iVar21 == 0))
      {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    CVar20 = curl_url_get(pCVar29,CURLUPART_PATH,&(data->state).up.path,0);
    switch(CVar20) {
    case CURLUE_OK:
      break;
    default:
      goto switchD_003cc804_caseD_1;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_003cc599_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_003cc599_caseD_8;
    }
  default:
    return CURLE_URL_MALFORMAT;
  case CURLUE_UNSUPPORTED_SCHEME:
    goto switchD_003cc599_caseD_5;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_003cc599_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
    goto switchD_003cc599_caseD_8;
  }
  ppcVar2 = &(data->state).up.port;
  CVar20 = curl_url_get(pCVar29,CURLUPART_PORT,ppcVar2,1);
  if (CVar20 == CURLUE_OK) {
    uVar32 = strtoul(*ppcVar2,(char **)0x0,10);
    uVar19 = curlx_ultous(uVar32);
    conn->remote_port = (uint)uVar19;
  }
  else {
    iVar21 = Curl_strcasecompare("file",part->scheme);
    if (iVar21 == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  curl_url_get(pCVar29,CURLUPART_QUERY,&(data->state).up.query,0);
  pcVar28 = (data->state).up.hostname;
  if (pcVar28 == (char *)0x0) {
    pcVar28 = "";
  }
  if (*pcVar28 == '[') {
    CVar20 = curl_url_get(pCVar29,CURLUPART_ZONEID,&zoneid,0);
    puVar1 = &(conn->bits).field_0x5;
    *puVar1 = *puVar1 | 2;
    pcVar51 = pcVar28 + 1;
    sVar31 = strlen(pcVar51);
    pcVar28[sVar31] = '\0';
    pcVar28 = pcVar51;
    if (zoneid != (char *)0x0 && CVar20 == CURLUE_OK) {
      uVar32 = strtoul(zoneid,local_138,10);
      if (uVar32 < 0xffffffff && *(char *)CONCAT71(local_138[0]._1_7_,(byte)local_138[0]) == '\0') {
        conn->scope_id = (uint)uVar32;
      }
      (*Curl_cfree)(zoneid);
    }
  }
  pcVar28 = (*Curl_cstrdup)(pcVar28);
  (conn->host).rawalloc = pcVar28;
  if (pcVar28 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  (conn->host).name = pcVar28;
  uVar39 = (data->set).scope_id;
  if (uVar39 != 0) {
    conn->scope_id = uVar39;
  }
  pcVar28 = (data->set).str[0x39];
  if (pcVar28 != (char *)0x0) {
    pcVar28 = (*Curl_cstrdup)(pcVar28);
    conn->oauth_bearer = pcVar28;
    if (pcVar28 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  data_00 = conn->data;
  if (((conn->bits).field_0x5 & 1) == 0) {
LAB_003cc998:
    pcVar28 = (data_00->set).str[0x15];
    if (pcVar28 == (char *)0x0) {
      pcVar28 = (char *)0x0;
LAB_003ccaa2:
      pcVar51 = (data_00->set).str[0x16];
      if (pcVar51 == (char *)0x0) {
        local_2f0 = (char *)0x0;
      }
      else {
        local_2f0 = (*Curl_cstrdup)(pcVar51);
        if (local_2f0 == (char *)0x0) {
          local_2f0 = (char *)0x0;
          Curl_failf(data_00,"memory shortage");
          CVar22 = CURLE_OUT_OF_MEMORY;
          goto LAB_003cd035;
        }
      }
      if ((data_00->set).str[0x31] == (char *)0x0) {
        pcVar51 = "no_proxy";
        local_2e0 = curl_getenv("no_proxy");
        if (local_2e0 == (char *)0x0) {
          pcVar51 = "NO_PROXY";
          local_2e0 = curl_getenv("NO_PROXY");
          if (local_2e0 == (char *)0x0) goto LAB_003ccb42;
        }
        Curl_infof(conn->data,"Uses proxy env variable %s == \'%s\'\n",pcVar51,local_2e0);
      }
      else {
LAB_003ccb42:
        local_2e0 = (char *)0x0;
      }
      pcVar51 = (data_00->set).str[0x31];
      if (pcVar51 == (char *)0x0) {
        pcVar51 = local_2e0;
      }
      if ((pcVar51 == (char *)0x0) || (*pcVar51 == '\0')) {
LAB_003ccd56:
        if (pcVar28 == (char *)0x0 && local_2f0 == (char *)0x0) {
          pcVar28 = conn->handler->scheme;
          for (lVar34 = 0; cVar3 = pcVar28[lVar34], cVar3 != '\0'; lVar34 = lVar34 + 1) {
            iVar21 = tolower((int)cVar3);
            *(char *)((long)&zoneid + lVar34) = (char)iVar21;
          }
          *(undefined4 *)((long)&zoneid + lVar34 + 3) = 0x79786f;
          *(undefined4 *)((long)&zoneid + lVar34) = 0x6f72705f;
          pcVar51 = (char *)&zoneid;
          pcVar28 = curl_getenv(pcVar51);
          if (pcVar28 == (char *)0x0) {
            pcVar51 = (char *)&zoneid;
            iVar21 = Curl_strcasecompare("http_proxy",pcVar51);
            if (iVar21 == 0) {
              Curl_strntoupper(pcVar51,pcVar51,0x80);
              pcVar28 = curl_getenv(pcVar51);
              if (pcVar28 != (char *)0x0) goto LAB_003cce1e;
            }
            pcVar51 = "all_proxy";
            pcVar28 = curl_getenv("all_proxy");
            if (pcVar28 != (char *)0x0) goto LAB_003cce1e;
            pcVar51 = "ALL_PROXY";
            pcVar28 = curl_getenv("ALL_PROXY");
            if (pcVar28 != (char *)0x0) goto LAB_003cce1e;
            pcVar28 = (char *)0x0;
          }
          else {
LAB_003cce1e:
            Curl_infof(conn->data,"Uses proxy env variable %s == \'%s\'\n",pcVar51,pcVar28);
          }
          local_2f0 = (char *)0x0;
        }
      }
      else {
        local_2e8 = (byte *)(conn->host).name;
        iVar21 = Curl_strcasecompare("*",pcVar51);
        if (iVar21 == 0) {
          sVar31 = strlen(pcVar51);
          if (*local_2e8 == '[') {
            pcVar42 = strchr((char *)local_2e8,0x5d);
            if (pcVar42 == (char *)0x0) goto LAB_003ccd56;
            local_2e8 = (byte *)((char *)local_2e8 + 1);
            local_2a8 = (long)pcVar42 - (long)local_2e8;
          }
          else {
            local_2a8 = strlen((char *)local_2e8);
          }
          sVar50 = 0;
          while (sVar50 < sVar31) {
            while( true ) {
              if (sVar31 == sVar50) goto LAB_003ccd56;
              bVar45 = pcVar51[sVar50];
              local_2d0 = sVar50;
              if ((0x2c < (ulong)bVar45) || ((0x100100000001U >> ((ulong)bVar45 & 0x3f) & 1) == 0))
              break;
              sVar50 = sVar50 + 1;
            }
            while ((sVar16 = sVar31, sVar31 != local_2d0 &&
                   ((0x2c < (ulong)(byte)pcVar51[local_2d0] ||
                    (sVar16 = local_2d0,
                    (0x100100000001U >> ((ulong)(byte)pcVar51[local_2d0] & 0x3f) & 1) == 0))))) {
              local_2d0 = local_2d0 + 1;
            }
            local_2d0 = sVar16;
            uVar32 = (ulong)(bVar45 == 0x2e);
            sVar36 = (local_2d0 - uVar32) - sVar50;
            if (sVar36 <= local_2a8) {
              iVar21 = Curl_strncasecompare
                                 (pcVar51 + sVar50 + uVar32,
                                  (char *)(local_2e8 + (uVar32 - local_2d0) + sVar50 + local_2a8),
                                  sVar36);
              if ((iVar21 != 0) &&
                 (((local_2d0 - uVar32) - local_2a8 == sVar50 ||
                  (local_2e8[(sVar50 - 1) + (uVar32 - local_2d0) + local_2a8] == '.'))))
              goto LAB_003ccbdf;
            }
            sVar50 = local_2d0 + 1;
          }
          goto LAB_003ccd56;
        }
LAB_003ccbdf:
        (*Curl_cfree)(pcVar28);
        (*Curl_cfree)(local_2f0);
        local_2f0 = (char *)0x0;
        pcVar28 = (char *)0x0;
      }
      (*Curl_cfree)(local_2e0);
      if (pcVar28 == (char *)0x0) {
LAB_003cce74:
        pcVar28 = (char *)0x0;
      }
      else if ((*pcVar28 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar28);
        goto LAB_003cce74;
      }
      if (local_2f0 == (char *)0x0) {
LAB_003cceac:
        if (pcVar28 != (char *)0x0) {
          local_2f0 = (char *)0x0;
          bVar52 = false;
LAB_003ccec1:
          CVar22 = parse_proxy(data_00,conn,pcVar28,(conn->http_proxy).proxytype);
          (*Curl_cfree)(pcVar28);
          if (CVar22 != CURLE_OK) goto LAB_003cd032;
          if (bVar52) goto LAB_003cceed;
          goto LAB_003ccf19;
        }
        uVar39 = *(uint *)&(conn->bits).field_0x4 & 0xffffff9f;
      }
      else {
        if ((*local_2f0 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
          (*Curl_cfree)(local_2f0);
          goto LAB_003cceac;
        }
        bVar52 = true;
        if (pcVar28 != (char *)0x0) goto LAB_003ccec1;
LAB_003cceed:
        CVar22 = parse_proxy(data_00,conn,local_2f0,(conn->socks_proxy).proxytype);
        (*Curl_cfree)(local_2f0);
        if (CVar22 != CURLE_OK) goto LAB_003cca91;
LAB_003ccf19:
        if ((conn->http_proxy).host.rawalloc == (char *)0x0) {
          uVar39 = *(uint *)&(conn->bits).field_0x4 & 0xffffbfdf;
          *(uint *)&(conn->bits).field_0x4 = uVar39;
          if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_003ccff6;
          if ((conn->socks_proxy).user == (char *)0x0) {
            pcVar28 = (conn->socks_proxy).passwd;
            (conn->socks_proxy).user = (conn->http_proxy).user;
            (conn->http_proxy).user = (char *)0x0;
            (*Curl_cfree)(pcVar28);
            (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
            (conn->http_proxy).passwd = (char *)0x0;
            uVar39 = *(uint *)&(conn->bits).field_0x4;
          }
        }
        else {
          uVar39 = *(uint *)&(conn->bits).field_0x4;
          if ((conn->handler->protocol & 3) == 0) {
            if (((conn->handler->flags & 0x800) == 0) || ((uVar39 & 0x4000) != 0)) {
              uVar39 = uVar39 | 0x4000;
            }
            else {
              conn->handler = &Curl_handler_http;
            }
          }
          uVar39 = uVar39 | 0x20;
          if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_003ccff6:
            uVar39 = uVar39 & 0xffffffbf;
            goto LAB_003ccff9;
          }
        }
        uVar39 = uVar39 | 0x40;
      }
LAB_003ccff9:
      uVar40 = 0x10;
      if ((uVar39 & 0x20) == 0) {
        uVar40 = uVar39 >> 2 & 0x10;
      }
      *(uint *)&(conn->bits).field_0x4 = uVar39 & 0xffffffef | uVar40;
      if (uVar40 == 0) {
        *(uint *)&(conn->bits).field_0x4 = uVar39 & 0xffffbe8f;
      }
      local_2f0 = (char *)0x0;
      CVar22 = CURLE_OK;
    }
    else {
      pcVar28 = (*Curl_cstrdup)(pcVar28);
      if (pcVar28 != (char *)0x0) goto LAB_003ccaa2;
      local_2f0 = (char *)0x0;
      Curl_failf(data_00,"memory shortage");
      CVar22 = CURLE_OUT_OF_MEMORY;
    }
LAB_003cd032:
    pcVar28 = (char *)0x0;
  }
  else {
    memset(&zoneid,0,0x100);
    memset(local_138,0,0x100);
    pcVar28 = (data_00->set).str[0x2f];
    if (pcVar28 != (char *)0x0) {
      strncpy((char *)&zoneid,pcVar28,0x100);
      local_139 = 0;
    }
    pcVar28 = (data_00->set).str[0x30];
    if (pcVar28 != (char *)0x0) {
      strncpy((char *)local_138,pcVar28,0x100);
      local_39 = 0;
    }
    CVar22 = Curl_urldecode(data_00,(char *)&zoneid,0,&(conn->http_proxy).user,(size_t *)0x0,false);
    if (CVar22 != CURLE_OK) {
LAB_003cca91:
      local_2f0 = (char *)0x0;
      goto LAB_003cd032;
    }
    local_2f0 = (char *)0x0;
    CVar22 = Curl_urldecode(data_00,(char *)local_138,0,&(conn->http_proxy).passwd,(size_t *)0x0,
                            false);
    pcVar28 = (char *)0x0;
    if (CVar22 == CURLE_OK) goto LAB_003cc998;
  }
LAB_003cd035:
  (*Curl_cfree)(local_2f0);
  (*Curl_cfree)(pcVar28);
  if (CVar22 != CURLE_OK) {
    return CVar22;
  }
  if (((conn->given->flags & 1) != 0) &&
     (uVar39 = *(uint *)&(conn->bits).field_0x4, (uVar39 & 0x20) != 0)) {
    *(uint *)&(conn->bits).field_0x4 = uVar39 | 0x4000;
  }
  lVar34 = (data->set).use_port;
  if ((lVar34 != 0) && (((data->state).field_0x4e4 & 0x10) != 0)) {
    conn->remote_port = (uint)lVar34 & 0xffff;
    curl_msnprintf((char *)&zoneid,0x10,"%d");
    CVar20 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)&zoneid,0);
    if (CVar20 != CURLUE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  ppcVar2 = &conn->user;
  passwordp = &conn->passwd;
  if (((data->set).use_netrc == CURL_NETRC_REQUIRED) && (((conn->bits).field_0x4 & 0x80) != 0)) {
    bVar45 = *ppcVar2 != (char *)0x0;
    if ((bool)bVar45) {
      (*Curl_cfree)(*ppcVar2);
      *ppcVar2 = (char *)0x0;
    }
    bVar49 = *passwordp != (char *)0x0;
    if ((bool)bVar49) {
      (*Curl_cfree)(*passwordp);
      *passwordp = (char *)0x0;
    }
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 & 0x7f;
  }
  else {
    bVar45 = false;
    bVar49 = false;
  }
  if ((data->set).str[0x2c] != (char *)0x0) {
    (*Curl_cfree)(*ppcVar2);
    pcVar28 = (*Curl_cstrdup)((data->set).str[0x2c]);
    *ppcVar2 = pcVar28;
    if (pcVar28 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 | 0x80;
    bVar45 = true;
  }
  if ((data->set).str[0x2d] != (char *)0x0) {
    (*Curl_cfree)(*passwordp);
    pcVar28 = (*Curl_cstrdup)((data->set).str[0x2d]);
    *passwordp = pcVar28;
    if (pcVar28 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 | 0x80;
    bVar49 = true;
  }
  if ((data->set).str[0x2e] != (char *)0x0) {
    (*Curl_cfree)(conn->options);
    pcVar28 = (*Curl_cstrdup)((data->set).str[0x2e]);
    conn->options = pcVar28;
    if (pcVar28 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  puVar1 = &(conn->bits).field_0x6;
  *puVar1 = *puVar1 & 0xef;
  if (((data->set).use_netrc != CURL_NETRC_IGNORED) &&
     ((((*ppcVar2 == (char *)0x0 || (**ppcVar2 == '\0')) || (*passwordp == (char *)0x0)) ||
      (**passwordp == '\0')))) {
    zoneid = (char *)((ulong)zoneid & 0xffffffffffffff00);
    local_138[0]._0_1_ = false;
    iVar21 = Curl_parsenetrc((conn->host).name,ppcVar2,passwordp,(_Bool *)&zoneid,(_Bool *)local_138
                             ,(data->set).str[0x14]);
    if (iVar21 < 1) {
      if (iVar21 < 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      puVar1 = &(conn->bits).field_0x4;
      *(uint *)puVar1 = *(uint *)puVar1 | 0x100080;
      bVar45 = bVar45 | (byte)zoneid;
      bVar49 = bVar49 | (byte)local_138[0];
    }
    else {
      Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                 (conn->host).name);
    }
  }
  if (bVar45 != 0) {
    CVar20 = curl_url_set((data->state).uh,CURLUPART_USER,*ppcVar2,0);
    switch(CVar20) {
    case CURLUE_OK:
      break;
    case CURLUE_BAD_HANDLE:
    case CURLUE_BAD_PARTPOINTER:
    case CURLUE_MALFORMED_INPUT:
    case CURLUE_BAD_PORT_NUMBER:
    case CURLUE_URLDECODE:
      return CURLE_URL_MALFORMAT;
    case CURLUE_UNSUPPORTED_SCHEME:
switchD_003cc599_caseD_5:
      return CURLE_UNSUPPORTED_PROTOCOL;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_003cc599_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_003cc599_caseD_8;
    default:
switchD_003cc804_caseD_1:
      return CURLE_URL_MALFORMAT;
    }
  }
  if (bVar49 != 0) {
    CVar22 = CURLE_URL_MALFORMAT;
    CVar20 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,*passwordp,0);
    switch(CVar20) {
    case CURLUE_OK:
      break;
    default:
      goto switchD_003cd33e_caseD_1;
    case CURLUE_UNSUPPORTED_SCHEME:
      return CURLE_UNSUPPORTED_PROTOCOL;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_003cc599_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
switchD_003cc599_caseD_8:
      return CURLE_LOGIN_DENIED;
    }
  }
  if (((conn->handler->flags & 0x20) == 0) || (((conn->bits).field_0x4 & 0x80) != 0)) {
    pcVar51 = "";
    pcVar28 = "";
  }
  else {
    pcVar51 = "ftp@example.com";
    pcVar28 = "anonymous";
  }
  if (*ppcVar2 == (char *)0x0) {
    pcVar28 = (*Curl_cstrdup)(pcVar28);
    *ppcVar2 = pcVar28;
    if (pcVar28 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if (*passwordp == (char *)0x0) {
    pcVar28 = (*Curl_cstrdup)(pcVar51);
    *passwordp = pcVar28;
    if (pcVar28 == (char *)0x0 && *ppcVar2 != (char *)0x0) {
      pcVar28 = (*Curl_cstrdup)("");
      *passwordp = pcVar28;
      return CURLE_OUT_OF_MEMORY;
    }
    if (pcVar28 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  local_2f8 = (connectdata *)&(data->set).connect_to;
  pcVar28 = (char *)0x0;
  uVar32 = 0xffffffff;
LAB_003cd3df:
  if ((((int)uVar32 == -1) && (pcVar28 == (char *)0x0)) &&
     (pcVar6 = *(curl_slist **)local_2f8, pcVar6 != (curl_slist *)0x0)) {
    pcVar28 = pcVar6->data;
    if (*pcVar28 == ':') {
LAB_003cd49b:
      if (pcVar28[1] != ':') {
        pcVar51 = strchr(pcVar28 + 1,0x3a);
        if (pcVar51 != (char *)0x0) {
          zoneid = (char *)0x0;
          lVar34 = strtol(pcVar28 + 1,&zoneid,10);
          if ((zoneid == pcVar51) && (lVar34 == conn->remote_port)) {
            pcVar28 = pcVar51 + 1;
            goto LAB_003cd4a6;
          }
        }
        goto LAB_003cd573;
      }
      pcVar28 = pcVar28 + 2;
LAB_003cd4a6:
      if (*pcVar28 == '\0') goto LAB_003cd573;
      pbVar33 = (byte *)(*Curl_cstrdup)(pcVar28);
      if (pbVar33 == (byte *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      __s = pbVar33;
      local_2e8 = pbVar33;
      if (*pbVar33 == 0x5b) {
        pbVar47 = pbVar33 + 2;
        local_2e8 = pbVar33 + 1;
        for (__s = local_2e8; *__s != 0; __s = __s + 1) {
          iVar21 = Curl_isxdigit((uint)*__s);
          if (((iVar21 == 0) && (bVar45 = *__s, bVar45 != 0x2e)) && (bVar45 != 0x3a)) {
            if (bVar45 != 0x25) goto LAB_003cd647;
            if (__s[1] - 0x32 == 0) {
              iVar21 = 0x35 - (uint)__s[2];
            }
            else {
              iVar21 = -(__s[1] - 0x32);
            }
            if (iVar21 != 0) {
              Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
            }
            goto LAB_003cd601;
          }
          pbVar47 = pbVar47 + 1;
        }
        goto LAB_003cd654;
      }
      goto LAB_003cd665;
    }
    bVar52 = (*(uint *)&(conn->bits).field_0x4 >> 9 & 1) == 0;
    pcVar51 = "[";
    if (bVar52) {
      pcVar51 = "";
    }
    pcVar42 = "]";
    if (bVar52) {
      pcVar42 = "";
    }
    pcVar51 = curl_maprintf("%s%s%s",pcVar51,(conn->host).name,pcVar42);
    if (pcVar51 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    sVar31 = strlen(pcVar51);
    iVar21 = Curl_strncasecompare(pcVar28,pcVar51,sVar31);
    (*Curl_cfree)(pcVar51);
    if ((iVar21 != 0) && (pcVar28[sVar31] == ':')) {
      pcVar28 = pcVar28 + sVar31;
      goto LAB_003cd49b;
    }
LAB_003cd573:
    pcVar28 = (char *)0x0;
    uVar32 = 0xffffffff;
    goto LAB_003cd57c;
  }
  idnconvert_hostname(conn,&conn->host);
  uVar39 = *(uint *)&(conn->bits).field_0x4;
  if ((uVar39 & 4) != 0) {
    idnconvert_hostname(conn,&conn->conn_to_host);
    uVar39 = *(uint *)&(conn->bits).field_0x4;
  }
  if ((uVar39 & 0x20) != 0) {
    idnconvert_hostname(conn,&(conn->http_proxy).host);
    uVar39 = *(uint *)&(conn->bits).field_0x4;
  }
  if ((uVar39 & 0x40) != 0) {
    idnconvert_hostname(conn,&(conn->socks_proxy).host);
    uVar39 = *(uint *)&(conn->bits).field_0x4;
  }
  if ((uVar39 & 4) != 0) {
    iVar21 = Curl_strcasecompare((conn->conn_to_host).name,(conn->host).name);
    uVar39 = *(uint *)&(conn->bits).field_0x4;
    if (iVar21 != 0) {
      uVar39 = uVar39 & 0xfffffffb;
      *(uint *)&(conn->bits).field_0x4 = uVar39;
    }
  }
  if (((uVar39 & 8) != 0) && (conn->conn_to_port == conn->remote_port)) {
    uVar39 = uVar39 & 0xfffffff7;
    *(uint *)&(conn->bits).field_0x4 = uVar39;
  }
  if ((uVar39 & 0x20) != 0 && (uVar39 & 0xc) != 0) {
    *(uint *)&(conn->bits).field_0x4 = uVar39 | 0x4000;
  }
  conn->socktype = 1;
  pCVar30 = conn->handler;
  if (pCVar30->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
    CVar22 = (*pCVar30->setup_connection)(conn);
    if (CVar22 != CURLE_OK) {
      return CVar22;
    }
    pCVar30 = conn->handler;
  }
  if (conn->port < 0) {
    conn->port = pCVar30->defport;
  }
  conn->recv[0] = Curl_recv_plain;
  conn->send[0] = Curl_send_plain;
  conn->recv[1] = Curl_recv_plain;
  conn->send[1] = Curl_send_plain;
  *(uint *)&(conn->bits).field_0x4 =
       *(uint *)&(conn->bits).field_0x4 & 0xf7ffffff |
       (uint)(*(ulong *)&(data->set).field_0x878 >> 0x11) & 0x8000000;
  if ((pCVar30->flags & 0x10) != 0) {
    Curl_persistconninfo(conn);
    CVar22 = (*conn->handler->connect_it)(conn,(_Bool *)&zoneid);
    if (CVar22 == CURLE_OK) {
      (conn->bits).tcpconnect[0] = true;
      CVar23 = Curl_conncache_add_conn((data->state).conn_cache,conn);
      if (CVar23 != CURLE_OK) {
        return CVar23;
      }
      CVar23 = setup_range(data);
      if (CVar23 != CURLE_OK) {
        (*conn->handler->done)(conn,CVar23,false);
        return CVar23;
      }
      Curl_attach_connnection(data,conn);
      Curl_setup_transfer(data,-1,-1,false,-1);
    }
    Curl_init_do(data,conn);
switchD_003cd33e_caseD_1:
    return CVar22;
  }
  pcVar28 = (data->set).str[0x1b];
  (data->set).ssl.primary.CApath = (data->set).str[0x1a];
  (data->set).proxy_ssl.primary.CApath = pcVar28;
  (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
  (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
  pcVar28 = (data->set).str[0x25];
  (data->set).ssl.primary.random_file = pcVar28;
  (data->set).proxy_ssl.primary.random_file = pcVar28;
  pcVar28 = (data->set).str[0x24];
  (data->set).ssl.primary.egdsocket = pcVar28;
  (data->set).proxy_ssl.primary.egdsocket = pcVar28;
  (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
  (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
  (data->set).ssl.primary.cipher_list13 = (data->set).str[0x22];
  (data->set).proxy_ssl.primary.cipher_list13 = (data->set).str[0x23];
  (data->set).ssl.CRLfile = (data->set).str[0x27];
  (data->set).proxy_ssl.CRLfile = (data->set).str[0x28];
  (data->set).ssl.issuercert = (data->set).str[0x29];
  (data->set).proxy_ssl.issuercert = (data->set).str[0x2a];
  pcVar28 = (data->set).str[0];
  pcVar51 = (data->set).str[1];
  (data->set).ssl.cert = pcVar28;
  (data->set).proxy_ssl.cert = pcVar51;
  (data->set).ssl.cert_type = (data->set).str[2];
  (data->set).proxy_ssl.cert_type = (data->set).str[3];
  pcVar42 = (data->set).str[0xe];
  (data->set).ssl.key = (data->set).str[0xd];
  (data->set).proxy_ssl.key = pcVar42;
  (data->set).ssl.key_type = (data->set).str[0x11];
  (data->set).proxy_ssl.key_type = (data->set).str[0x12];
  (data->set).ssl.key_passwd = (data->set).str[0xf];
  (data->set).proxy_ssl.key_passwd = (data->set).str[0x10];
  (data->set).ssl.primary.clientcert = pcVar28;
  (data->set).proxy_ssl.primary.clientcert = pcVar51;
  dest = &conn->ssl_config;
  _Var18 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,dest);
  if (!_Var18) {
switchD_003cc599_caseD_7:
    return CURLE_OUT_OF_MEMORY;
  }
  dest_00 = &conn->proxy_ssl_config;
  _Var18 = Curl_clone_primary_ssl_config(&(data->set).proxy_ssl.primary,dest_00);
  if (!_Var18) {
    return CURLE_OUT_OF_MEMORY;
  }
  cVar56 = Curl_now();
  pcVar7 = (data->state).conn_cache;
  uVar8 = (pcVar7->last_cleanup).tv_sec;
  uVar9 = (pcVar7->last_cleanup).tv_usec;
  older.tv_usec = uVar9;
  older.tv_sec = uVar8;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar56._0_12_,0);
  newer.tv_usec = SUB124(cVar56._0_12_,8);
  older._12_4_ = 0;
  tVar35 = Curl_timediff(newer,older);
  if (999 < tVar35) {
    local_230 = (connectdata *)0x0;
    zoneid = (char *)data;
    while (_Var18 = Curl_conncache_foreach
                              (data,(data->state).conn_cache,&zoneid,call_extract_if_dead), _Var18)
    {
      Curl_disconnect(data,local_230,true);
    }
    pcVar7 = (data->state).conn_cache;
    (pcVar7->last_cleanup).tv_sec = cVar56.tv_sec;
    (pcVar7->last_cleanup).tv_usec = cVar56.tv_usec;
  }
  uVar32 = *(ulong *)&(data->set).field_0x878;
  if ((uVar32 >> 0x21 & 1) == 0) {
    if ((uVar32 & 0x2000000000) == 0) goto LAB_003cdc50;
  }
  else {
    bVar52 = false;
    if (((uVar32 & 0x2000000000) != 0) ||
       (bVar52 = false, (*(ushort *)&(data->state).field_0x4e4 & 2) == 0)) goto LAB_003ce937;
LAB_003cdc50:
    iVar21 = IsMultiplexingPossible(data,conn);
    cVar56 = Curl_now();
    if (((data->state).authhost.want & 0x28) == 0) {
      bVar52 = false;
    }
    else {
      bVar52 = (conn->handler->protocol & 3) != 0;
    }
    if ((((conn->bits).field_0x5 & 1) == 0) || (((data->state).authproxy.want & 0x28) == 0)) {
      bVar53 = false;
    }
    else {
      bVar53 = (conn->handler->protocol & 3) != 0;
    }
    pcVar37 = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
    if (pcVar37 != (connectbundle *)0x0) {
      phVar15 = &conn->conn_to_host;
      if (((conn->bits).field_0x4 & 4) == 0) {
        phVar15 = &conn->host;
      }
      pcVar28 = "serially";
      if (pcVar37->multiuse == 2) {
        pcVar28 = "can multiplex";
      }
      bVar54 = false;
      Curl_infof(data,"Found bundle for host %s: %p [%s]\n",phVar15->name,pcVar37,pcVar28);
      if (iVar21 == 0) goto LAB_003cdded;
      iVar21 = pcVar37->multiuse;
      bVar54 = iVar21 != 0;
      if (!bVar54) {
        if (((data->set).field_0x87e & 1) != 0) {
          Curl_infof(data,"Server doesn\'t support multiplex yet, wait\n");
          Curl_conncache_unlock(data);
LAB_003ceca2:
          bVar52 = true;
          goto LAB_003ce937;
        }
        Curl_infof(data,"Server doesn\'t support multiplex (yet)\n");
        iVar21 = pcVar37->multiuse;
      }
      if ((iVar21 == 2) && (_Var18 = Curl_multiplex_wanted(data->multi), !_Var18)) {
        bVar54 = false;
        Curl_infof(data,"Could multiplex, but not asked to!\n");
      }
      if (pcVar37->multiuse == -1) {
        bVar54 = false;
        Curl_infof(data,"Can not multiplex, even if we wanted to!\n");
      }
LAB_003cdded:
      pcVar48 = (pcVar37->conn_list).head;
      local_298 = (connectdata *)0x0;
      bVar17 = false;
LAB_003cde3b:
      do {
        while( true ) {
          do {
            bVar14 = bVar17;
            if (pcVar48 == (curl_llist_element *)0x0) {
              if (local_298 != (connectdata *)0x0) {
                bVar52 = false;
                local_2f8 = local_298;
                goto LAB_003ce52e;
              }
              Curl_conncache_unlock(data);
              if ((!bVar14) || (((data->set).field_0x87e & 1) == 0)) goto LAB_003ce935;
              Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
              goto LAB_003ceca2;
            }
            local_2f8 = (connectdata *)pcVar48->ptr;
            pcVar48 = pcVar48->next;
            bVar17 = bVar14;
          } while (*(int *)&(local_2f8->bits).field_0x4 < 0);
          if ((local_2f8->data != (Curl_easy *)0x0) ||
             (uVar10 = (local_2f8->lastused).tv_sec, uVar11 = (local_2f8->lastused).tv_usec,
             older_00.tv_usec = uVar11, older_00.tv_sec = uVar10, newer_00._12_4_ = 0,
             newer_00.tv_sec = SUB128(cVar56._0_12_,0), newer_00.tv_usec = SUB124(cVar56._0_12_,8),
             older_00._12_4_ = 0, tVar35 = Curl_timediff(newer_00,older_00),
             tVar35 / 1000000 <= (data->set).maxage_conn)) break;
          Curl_infof(data,"Too old connection (%ld seconds), disconnect it\n",tVar35 / 1000);
LAB_003cded5:
          Curl_disconnect(data,local_2f8,true);
        }
        _Var18 = extract_if_dead(local_2f8,data);
        if (_Var18) goto LAB_003cded5;
        if ((local_2f8->easyq).size == 0) {
          if (bVar54) {
            bVar55 = false;
            goto LAB_003cdf2f;
          }
LAB_003cdf54:
          uVar39 = *(uint *)&(local_2f8->bits).field_0x4;
          if (local_2f8->sock[0] == -1) {
            bVar14 = (bool)(bVar14 | (uVar39 & 1) == 0);
          }
          else if ((uVar39 & 1) == 0) {
            bVar13 = false;
            bVar55 = false;
            goto LAB_003cdf86;
          }
          Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse\n",
                     local_2f8->connection_id);
          bVar17 = bVar14;
          goto LAB_003cde3b;
        }
        bVar55 = pcVar37->multiuse == 2;
        if (bVar54) {
LAB_003cdf2f:
          uVar39 = *(uint *)&(local_2f8->bits).field_0x4;
          bVar13 = true;
          if ((~uVar39 & 0x1001) != 0) {
LAB_003cdf86:
            pCVar30 = conn->handler;
            if ((((local_2f8->handler->flags ^ pCVar30->flags) & 1) == 0) ||
               ((uVar40 = get_protocol_family(local_2f8->handler->protocol),
                uVar40 == pCVar30->protocol && ((local_2f8->field_0x62c & 1) != 0)))) {
              uVar40 = *(uint *)&(conn->bits).field_0x4;
              uVar46 = uVar40 ^ uVar39;
              if (((uVar46 & 0x20) == 0) &&
                 (uVar41 = uVar40 >> 6 & 1, uVar41 == ((uVar39 >> 6 & 1) != 0))) {
                if (uVar41 != 0) {
                  _Var18 = proxy_info_matches(&conn->socks_proxy,&local_2f8->socks_proxy);
                  if (!_Var18) goto LAB_003cde3b;
                  uVar40 = *(uint *)&(conn->bits).field_0x4;
                  uVar46 = *(uint *)&(local_2f8->bits).field_0x4 ^ uVar40;
                }
                if ((uVar46 & 0xc) == 0) {
                  if ((uVar40 & 0x20) != 0) {
                    _Var18 = proxy_info_matches(&conn->http_proxy,&local_2f8->http_proxy);
                    if ((!_Var18) ||
                       (((*(uint *)&(local_2f8->bits).field_0x4 ^ *(uint *)&(conn->bits).field_0x4)
                         >> 0xe & 1) != 0)) goto LAB_003cde3b;
                    if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
                      if ((conn->handler->flags & 1) == 0) {
                        _Var18 = Curl_ssl_config_matches(dest,&local_2f8->ssl_config);
                        if (!_Var18) goto LAB_003cde3b;
                        sVar5 = local_2f8->ssl[0].state;
                      }
                      else {
                        _Var18 = Curl_ssl_config_matches(dest_00,&local_2f8->proxy_ssl_config);
                        if (!_Var18) goto LAB_003cde3b;
                        sVar5 = local_2f8->proxy_ssl[0].state;
                      }
                      if (sVar5 != ssl_connection_complete) goto LAB_003cde3b;
                    }
                  }
                  if (((bVar13) || (local_2f8->data == (Curl_easy *)0x0)) &&
                     (((local_2f8->easyq).size == 0 ||
                      ((local_2f8->data == (Curl_easy *)0x0 ||
                       (local_2f8->data->multi == conn->data->multi)))))) {
                    pcVar28 = conn->localdev;
                    if ((pcVar28 == (char *)0x0 && conn->localport == 0) ||
                       (((local_2f8->localport == conn->localport &&
                         (local_2f8->localportrange == conn->localportrange)) &&
                        ((pcVar28 == (char *)0x0 ||
                         ((local_2f8->localdev != (char *)0x0 &&
                          (iVar21 = strcmp(local_2f8->localdev,pcVar28), iVar21 == 0)))))))) {
                      pCVar30 = conn->handler;
                      uVar39 = pCVar30->flags;
                      if (((char)uVar39 < '\0') ||
                         ((iVar21 = strcmp(*ppcVar2,local_2f8->user), iVar21 == 0 &&
                          (iVar21 = strcmp(*passwordp,local_2f8->passwd), iVar21 == 0)))) {
                        uVar40 = *(uint *)&(conn->bits).field_0x4;
                        if (((uVar40 & 0x20) == 0) || ((uVar40 & 0x4000) != 0 || (uVar39 & 1) != 0))
                        {
                          iVar21 = Curl_strcasecompare(pCVar30->scheme,local_2f8->handler->scheme);
                          if ((iVar21 == 0) &&
                             ((uVar39 = get_protocol_family(local_2f8->handler->protocol),
                              uVar39 != conn->handler->protocol ||
                              ((local_2f8->field_0x62c & 1) == 0)))) goto LAB_003cde3b;
                          uVar39 = *(uint *)&(conn->bits).field_0x4;
                          if ((uVar39 & 4) != 0) {
                            iVar21 = Curl_strcasecompare((conn->conn_to_host).name,
                                                         (local_2f8->conn_to_host).name);
                            if (iVar21 == 0) goto LAB_003cde3b;
                            uVar39 = *(uint *)&(conn->bits).field_0x4;
                          }
                          if ((((((uVar39 & 8) != 0) &&
                                (conn->conn_to_port != local_2f8->conn_to_port)) ||
                               (iVar21 = Curl_strcasecompare((conn->host).name,
                                                             (local_2f8->host).name), iVar21 == 0))
                              || (conn->remote_port != local_2f8->remote_port)) ||
                             (((conn->handler->flags & 1) != 0 &&
                              ((_Var18 = Curl_ssl_config_matches(dest,&local_2f8->ssl_config),
                               !_Var18 ||
                               (bVar17 = true, local_2f8->ssl[0].state != ssl_connection_complete)))
                              ))) goto LAB_003cde3b;
                        }
                        if (bVar52) {
                          iVar21 = strcmp(*ppcVar2,local_2f8->user);
                          bVar17 = bVar14;
                          if (iVar21 != 0) goto LAB_003cde3b;
                          cVar24 = strcmp(*passwordp,local_2f8->passwd);
                        }
                        else {
                          cVar24 = local_2f8->http_ntlm_state;
                        }
                        bVar17 = bVar14;
                        if (cVar24 == NTLMSTATE_NONE) {
                          if (bVar53) {
                            pcVar28 = (local_2f8->http_proxy).user;
                            if (((pcVar28 == (char *)0x0) ||
                                (pcVar51 = (local_2f8->http_proxy).passwd, pcVar51 == (char *)0x0))
                               || ((iVar21 = strcmp((conn->http_proxy).user,pcVar28), iVar21 != 0 ||
                                   (iVar21 = strcmp((conn->http_proxy).passwd,pcVar51), iVar21 != 0)
                                   ))) goto LAB_003cde3b;
                          }
                          else {
                            if (local_2f8->proxy_ntlm_state != NTLMSTATE_NONE) goto LAB_003cde3b;
                            if (!bVar52) {
                              if ((bool)(bVar13 & bVar55)) {
                                bVar52 = false;
                                Curl_infof(data,"Multiplexed connection found!\n");
                              }
                              else {
                                bVar52 = false;
                              }
                              goto LAB_003ce52e;
                            }
                          }
                          if (((bVar52) && (local_2f8->http_ntlm_state != NTLMSTATE_NONE)) ||
                             ((local_298 = local_2f8, bVar53 &&
                              (local_2f8->proxy_ntlm_state != NTLMSTATE_NONE)))) goto LAB_003ce512;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_003cde3b;
        }
        if (pcVar37->multiuse != 2) goto LAB_003cdf54;
      } while( true );
    }
    Curl_conncache_unlock(data);
  }
LAB_003ce935:
  bVar52 = false;
LAB_003ce937:
  if ((conn->handler->flags & 0x100) != 0) {
    uVar32 = *(ulong *)&(data->set).field_0x878;
    if ((uVar32 >> 0x2e & 1) != 0) {
      puVar1 = &(conn->bits).field_0x7;
      *puVar1 = *puVar1 | 0x20;
      uVar32 = *(ulong *)&(data->set).field_0x878;
    }
    if ((uVar32 >> 0x2d & 1) != 0) {
      puVar1 = &(conn->bits).field_0x7;
      *puVar1 = *puVar1 | 0x10;
    }
  }
  if (bVar52) {
LAB_003ce978:
    Curl_infof(data,"No connections available.\n");
    conn_free(conn);
    *in_connect = (connectdata *)0x0;
    return CURLE_NO_CONNECTION_AVAILABLE;
  }
  pcVar37 = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
  if ((pcVar37 == (connectbundle *)0x0 || sVar25 == 0) || (pcVar37->num_connections < sVar25)) {
    Curl_conncache_unlock(data);
  }
  else {
    pcVar38 = Curl_conncache_extract_bundle(data,pcVar37);
    Curl_conncache_unlock(data);
    if (pcVar38 == (connectdata *)0x0) {
      Curl_infof(data,"No more connections allowed to host: %zu\n",sVar25);
      goto LAB_003ce978;
    }
    Curl_disconnect(data,pcVar38,false);
  }
  if ((sVar26 != 0) && (sVar25 = Curl_conncache_size(data), sVar26 <= sVar25)) {
    pcVar38 = Curl_conncache_extract_oldest(data);
    if (pcVar38 == (connectdata *)0x0) {
      Curl_infof(data,"No connections available in cache\n");
      goto LAB_003ce978;
    }
    Curl_disconnect(data,pcVar38,false);
  }
  CVar22 = Curl_conncache_add_conn((data->state).conn_cache,conn);
  if (CVar22 != CURLE_OK) {
    return CVar22;
  }
  if ((((data->state).authhost.picked & 0x28) != 0) &&
     (((data->state).authhost.field_0x18 & 1) != 0)) {
    Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
    (data->state).authhost.picked = 0;
    puVar1 = &(data->state).authhost.field_0x18;
    *puVar1 = *puVar1 & 0xfe;
  }
  local_2f8 = conn;
  if ((((data->state).authproxy.picked & 0x28) != 0) &&
     (((data->state).authproxy.field_0x18 & 1) != 0)) {
    Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
    (data->state).authproxy.picked = 0;
    puVar1 = &(data->state).authproxy.field_0x18;
    *puVar1 = *puVar1 & 0xfe;
  }
  goto LAB_003cea9a;
LAB_003cd601:
  __s = pbVar47;
  if (*pbVar47 == 0) goto LAB_003cd654;
  iVar21 = Curl_isalpha((uint)*pbVar47);
  if (((iVar21 == 0) && (iVar21 = Curl_isxdigit((uint)*pbVar47), iVar21 == 0)) &&
     ((bVar45 = *pbVar47, 1 < bVar45 - 0x2d && ((bVar45 != 0x7e && (bVar45 != 0x5f))))))
  goto LAB_003cd647;
  pbVar47 = pbVar47 + 1;
  goto LAB_003cd601;
LAB_003cd647:
  if (bVar45 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_003cd654:
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_003cd665:
  pcVar51 = strchr((char *)__s,0x3a);
  uVar32 = 0xffffffff;
  if (pcVar51 == (char *)0x0) {
LAB_003cd6c8:
    pcVar28 = (*Curl_cstrdup)((char *)local_2e8);
    CVar22 = CURLE_OK;
    if (pcVar28 == (char *)0x0) {
      pcVar28 = (char *)0x0;
      uVar32 = 0xffffffff;
      bVar52 = false;
      CVar22 = CURLE_OUT_OF_MEMORY;
    }
    else {
      bVar52 = true;
    }
  }
  else {
    zoneid = (char *)0x0;
    *pcVar51 = '\0';
    uVar32 = 0xffffffff;
    if (pcVar51[1] == '\0') goto LAB_003cd6c8;
    uVar32 = strtol(pcVar51 + 1,&zoneid,10);
    if (((zoneid == (char *)0x0) || (*zoneid == '\0')) && (uVar32 < 0x10000)) goto LAB_003cd6c8;
    pcVar28 = (char *)0x0;
    Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar51 + 1);
    bVar52 = true;
    uVar32 = 0xffffffff;
    CVar22 = CURLE_OK;
  }
  (*Curl_cfree)(pbVar33);
  if (!bVar52) {
    return CVar22;
  }
  if (pcVar28 == (char *)0x0) {
    pcVar28 = (char *)0x0;
  }
  else if (*pcVar28 != '\0') {
    (conn->conn_to_host).rawalloc = pcVar28;
    (conn->conn_to_host).name = pcVar28;
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 | 4;
    Curl_infof(data,"Connecting to hostname: %s\n",pcVar28);
    goto LAB_003cd593;
  }
LAB_003cd57c:
  puVar1 = &(conn->bits).field_0x4;
  *puVar1 = *puVar1 & 0xfb;
  (*Curl_cfree)(pcVar28);
  pcVar28 = (char *)0x0;
LAB_003cd593:
  if ((int)uVar32 < 0) {
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 & 0xf7;
  }
  else {
    conn->conn_to_port = (int)uVar32;
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 | 8;
    Curl_infof(data,"Connecting to port: %d\n",uVar32 & 0xffffffff);
  }
  local_2f8 = (connectdata *)&pcVar6->next;
  goto LAB_003cd3df;
LAB_003ce512:
  bVar52 = true;
LAB_003ce52e:
  local_2f8->data = data;
  Curl_conncache_unlock(data);
  if (((!bVar52) && (iVar21 = IsMultiplexingPossible(data,local_2f8), iVar21 != 0)) &&
     ((local_2f8->easyq).size != 0)) {
    Curl_infof(data,"Found connection %ld, with %zu requests on it\n",local_2f8->connection_id);
    sVar36 = Curl_conncache_bundle_size(local_2f8);
    if ((sVar36 < sVar25) && (sVar36 = Curl_conncache_size(data), sVar36 < sVar26)) {
      Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
      Curl_conncache_return_conn(local_2f8);
      bVar52 = false;
      goto LAB_003ce937;
    }
  }
  (*Curl_cfree)((conn->http_proxy).host.rawalloc);
  (*Curl_cfree)((conn->socks_proxy).host.rawalloc);
  Curl_free_primary_ssl_config(dest);
  Curl_free_primary_ssl_config(dest_00);
  local_2f8->data = conn->data;
  uVar40 = *(uint *)&(conn->bits).field_0x4 & 0x80;
  uVar39 = *(uint *)&(local_2f8->bits).field_0x4 & 0xffffff7f | uVar40;
  *(uint *)&(local_2f8->bits).field_0x4 = uVar39;
  if (uVar40 != 0) {
    (*Curl_cfree)(local_2f8->user);
    local_2f8->user = (char *)0x0;
    (*Curl_cfree)(local_2f8->passwd);
    local_2f8->passwd = (char *)0x0;
    pcVar28 = conn->passwd;
    local_2f8->user = *ppcVar2;
    local_2f8->passwd = pcVar28;
    conn->user = (char *)0x0;
    conn->passwd = (char *)0x0;
    uVar39 = *(uint *)&(local_2f8->bits).field_0x4;
  }
  uVar40 = *(uint *)&(conn->bits).field_0x4 & 0x100;
  *(uint *)&(local_2f8->bits).field_0x4 = uVar39 & 0xfffffeff | uVar40;
  if (uVar40 != 0) {
    (*Curl_cfree)((local_2f8->http_proxy).user);
    (local_2f8->http_proxy).user = (char *)0x0;
    (*Curl_cfree)((local_2f8->socks_proxy).user);
    (local_2f8->socks_proxy).user = (char *)0x0;
    (*Curl_cfree)((local_2f8->http_proxy).passwd);
    (local_2f8->http_proxy).passwd = (char *)0x0;
    (*Curl_cfree)((local_2f8->socks_proxy).passwd);
    (local_2f8->socks_proxy).passwd = (char *)0x0;
    pcVar28 = (conn->http_proxy).passwd;
    (local_2f8->http_proxy).user = (conn->http_proxy).user;
    (local_2f8->http_proxy).passwd = pcVar28;
    pcVar28 = (conn->socks_proxy).passwd;
    (local_2f8->socks_proxy).user = (conn->socks_proxy).user;
    (local_2f8->socks_proxy).passwd = pcVar28;
    (conn->socks_proxy).user = (char *)0x0;
    (conn->socks_proxy).passwd = (char *)0x0;
    (conn->http_proxy).user = (char *)0x0;
    (conn->http_proxy).passwd = (char *)0x0;
  }
  (*Curl_cfree)((local_2f8->host).rawalloc);
  (local_2f8->host).rawalloc = (char *)0x0;
  (*Curl_cfree)((local_2f8->conn_to_host).rawalloc);
  (local_2f8->conn_to_host).rawalloc = (char *)0x0;
  pcVar28 = (conn->host).rawalloc;
  pcVar51 = (conn->host).encalloc;
  pcVar42 = (conn->host).dispname;
  (local_2f8->host).name = (conn->host).name;
  (local_2f8->host).dispname = pcVar42;
  (local_2f8->host).rawalloc = pcVar28;
  (local_2f8->host).encalloc = pcVar51;
  pcVar28 = (conn->conn_to_host).encalloc;
  pcVar51 = (conn->conn_to_host).name;
  pcVar42 = (conn->conn_to_host).dispname;
  (local_2f8->conn_to_host).rawalloc = (conn->conn_to_host).rawalloc;
  (local_2f8->conn_to_host).encalloc = pcVar28;
  (local_2f8->conn_to_host).name = pcVar51;
  (local_2f8->conn_to_host).dispname = pcVar42;
  iVar21 = conn->conn_to_port;
  local_2f8->remote_port = conn->remote_port;
  local_2f8->conn_to_port = iVar21;
  (*Curl_cfree)(local_2f8->hostname_resolve);
  local_2f8->hostname_resolve = (char *)0x0;
  local_2f8->hostname_resolve = conn->hostname_resolve;
  conn->hostname_resolve = (char *)0x0;
  Curl_persistconninfo(local_2f8);
  puVar1 = &(local_2f8->bits).field_0x4;
  *puVar1 = *puVar1 | 2;
  (*Curl_cfree)(conn->user);
  conn->user = (char *)0x0;
  (*Curl_cfree)(conn->passwd);
  conn->passwd = (char *)0x0;
  (*Curl_cfree)(conn->options);
  conn->options = (char *)0x0;
  (*Curl_cfree)((conn->http_proxy).user);
  (conn->http_proxy).user = (char *)0x0;
  (*Curl_cfree)((conn->socks_proxy).user);
  (conn->socks_proxy).user = (char *)0x0;
  (*Curl_cfree)((conn->http_proxy).passwd);
  (conn->http_proxy).passwd = (char *)0x0;
  (*Curl_cfree)((conn->socks_proxy).passwd);
  (conn->socks_proxy).passwd = (char *)0x0;
  (*Curl_cfree)(conn->localdev);
  conn->localdev = (char *)0x0;
  Curl_llist_destroy(l,(void *)0x0);
  (*Curl_cfree)(conn->ssl_extra);
  (*Curl_cfree)(conn);
  *in_connect = local_2f8;
  pcVar28 = "proxy";
  if (((local_2f8->bits).field_0x4 & 0x10) == 0) {
    pcVar28 = "host";
  }
  lVar34 = 0x128;
  if (((local_2f8->socks_proxy).host.name == (char *)0x0) &&
     (lVar34 = 0x168, (local_2f8->http_proxy).host.name == (char *)0x0)) {
    lVar34 = 0xd8;
  }
  Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",local_2f8->connection_id,
             pcVar28,*(undefined8 *)((local_2f8->chunk).hexbuffer + lVar34 + -0x20));
LAB_003cea9a:
  Curl_init_do(data,local_2f8);
  CVar22 = setup_range(data);
  if (CVar22 != CURLE_OK) {
    return CVar22;
  }
  local_2f8->seek_func = (data->set).seek_func;
  local_2f8->seek_client = (data->set).seek_client;
  local_2d4 = CURLE_OK;
  tVar35 = Curl_timeleft(data,(curltime *)0x0,true);
  uVar39 = *(uint *)&(local_2f8->bits).field_0x4;
  if ((uVar39 & 2) != 0) {
    *async = false;
    goto LAB_003cece5;
  }
  if ((uVar39 & 0x10) == 0) {
    lVar34 = 0xf0;
    if ((uVar39 & 4) == 0) {
      lVar34 = 0xc0;
    }
    local_2f8->port = (long)*(int *)(local_2f8->primary_ip + ((ulong)((uVar39 & 8) >> 1) - 10));
    pcVar28 = (*Curl_cstrdup)(*(char **)((local_2f8->chunk).hexbuffer + lVar34 + -0x10));
    local_2f8->hostname_resolve = pcVar28;
    if (pcVar28 == (char *)0x0) {
LAB_003cecaa:
      local_2d4 = CURLE_OUT_OF_MEMORY;
      goto LAB_003cece5;
    }
    iVar21 = Curl_resolv_timeout(local_2f8,pcVar28,(int)local_2f8->port,(Curl_dns_entry **)&zoneid,
                                 tVar35);
    if (iVar21 == -2) {
LAB_003cecaf:
      local_2d4 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      if (iVar21 == 1) {
LAB_003cec84:
        *async = true;
      }
      else if (zoneid == (char *)0x0) {
        Curl_failf(data,"Couldn\'t resolve host \'%s\'",
                   *(undefined8 *)((local_2f8->chunk).hexbuffer + lVar34 + -8));
        local_2d4 = CURLE_COULDNT_RESOLVE_HOST;
        goto LAB_003ceccf;
      }
LAB_003cecc7:
      local_2d4 = CURLE_OK;
    }
  }
  else {
    uVar32 = (ulong)((uVar39 & 0x40) == 0);
    pcVar28 = (*Curl_cstrdup)((&local_2f8->socks_proxy)[uVar32].host.name);
    local_2f8->hostname_resolve = pcVar28;
    if (pcVar28 == (char *)0x0) goto LAB_003cecaa;
    iVar21 = Curl_resolv_timeout(local_2f8,pcVar28,(int)local_2f8->port,(Curl_dns_entry **)&zoneid,
                                 tVar35);
    if (iVar21 == -2) goto LAB_003cecaf;
    if (iVar21 == 1) goto LAB_003cec84;
    if (zoneid != (char *)0x0) goto LAB_003cecc7;
    Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",
               *(undefined8 *)((local_2f8->chunk).hexbuffer + ((uVar32 * 0x40 | 0x110) - 8)));
    local_2d4 = CURLE_COULDNT_RESOLVE_PROXY;
  }
LAB_003ceccf:
  local_2f8->dns_entry = (Curl_dns_entry *)zoneid;
LAB_003cece5:
  strip_trailing_dot(&local_2f8->host);
  uVar39 = *(uint *)&(local_2f8->bits).field_0x4;
  if ((uVar39 & 0x20) != 0) {
    strip_trailing_dot(&(local_2f8->http_proxy).host);
    uVar39 = *(uint *)&(local_2f8->bits).field_0x4;
  }
  if ((uVar39 & 0x40) != 0) {
    strip_trailing_dot(&(local_2f8->socks_proxy).host);
    uVar39 = *(uint *)&(local_2f8->bits).field_0x4;
  }
  if ((uVar39 & 4) != 0) {
    strip_trailing_dot(&local_2f8->conn_to_host);
  }
  return local_2d4;
}

Assistant:

static CURLcode create_conn(struct Curl_easy *data,
                            struct connectdata **in_connect,
                            bool *async)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn;
  struct connectdata *conn_temp = NULL;
  bool reuse;
  bool connections_available = TRUE;
  bool force_reuse = FALSE;
  bool waitpipe = FALSE;
  size_t max_host_connections = Curl_multi_max_host_connections(data->multi);
  size_t max_total_connections = Curl_multi_max_total_connections(data->multi);

  *async = FALSE;
  *in_connect = NULL;

  /*************************************************************
   * Check input data
   *************************************************************/
  if(!data->change.url) {
    result = CURLE_URL_MALFORMAT;
    goto out;
  }

  /* First, split up the current URL in parts so that we can use the
     parts for checking against the already present connections. In order
     to not have to modify everything at once, we allocate a temporary
     connection data struct and fill in for comparison purposes. */
  conn = allocate_conn(data);

  if(!conn) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  /* We must set the return variable as soon as possible, so that our
     parent can cleanup any possible allocs we may have done before
     any failure */
  *in_connect = conn;

  result = parseurlandfillconn(data, conn);
  if(result)
    goto out;

  if(data->set.str[STRING_BEARER]) {
    conn->oauth_bearer = strdup(data->set.str[STRING_BEARER]);
    if(!conn->oauth_bearer) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

#ifdef USE_UNIX_SOCKETS
  if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
    conn->unix_domain_socket = strdup(data->set.str[STRING_UNIX_SOCKET_PATH]);
    if(conn->unix_domain_socket == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
    conn->abstract_unix_socket = data->set.abstract_unix_socket;
  }
#endif

  /* After the unix socket init but before the proxy vars are used, parse and
     initialize the proxy vars */
#ifndef CURL_DISABLE_PROXY
  result = create_conn_helper_init_proxy(conn);
  if(result)
    goto out;
#endif

  /*************************************************************
   * If the protocol is using SSL and HTTP proxy is used, we set
   * the tunnel_proxy bit.
   *************************************************************/
  if((conn->given->flags&PROTOPT_SSL) && conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Figure out the remote port number and fix it in the URL
   *************************************************************/
  result = parse_remote_port(data, conn);
  if(result)
    goto out;

  /* Check for overridden login details and set them accordingly so they
     they are known when protocol->setup_connection is called! */
  result = override_login(data, conn, &conn->user, &conn->passwd,
                          &conn->options);
  if(result)
    goto out;

  result = set_login(conn); /* default credentials */
  if(result)
    goto out;

  /*************************************************************
   * Process the "connect to" linked list of hostname/port mappings.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  result = parse_connect_to_slist(data, conn, data->set.connect_to);
  if(result)
    goto out;

  /*************************************************************
   * IDN-convert the hostnames
   *************************************************************/
  result = idnconvert_hostname(conn, &conn->host);
  if(result)
    goto out;
  if(conn->bits.conn_to_host) {
    result = idnconvert_hostname(conn, &conn->conn_to_host);
    if(result)
      goto out;
  }
  if(conn->bits.httpproxy) {
    result = idnconvert_hostname(conn, &conn->http_proxy.host);
    if(result)
      goto out;
  }
  if(conn->bits.socksproxy) {
    result = idnconvert_hostname(conn, &conn->socks_proxy.host);
    if(result)
      goto out;
  }

  /*************************************************************
   * Check whether the host and the "connect to host" are equal.
   * Do this after the hostnames have been IDN-converted.
   *************************************************************/
  if(conn->bits.conn_to_host &&
     strcasecompare(conn->conn_to_host.name, conn->host.name)) {
    conn->bits.conn_to_host = FALSE;
  }

  /*************************************************************
   * Check whether the port and the "connect to port" are equal.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  if(conn->bits.conn_to_port && conn->conn_to_port == conn->remote_port) {
    conn->bits.conn_to_port = FALSE;
  }

  /*************************************************************
   * If the "connect to" feature is used with an HTTP proxy,
   * we set the tunnel_proxy bit.
   *************************************************************/
  if((conn->bits.conn_to_host || conn->bits.conn_to_port) &&
      conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Setup internals depending on protocol. Needs to be done after
   * we figured out what/if proxy to use.
   *************************************************************/
  result = setup_connection_internals(conn);
  if(result)
    goto out;

  conn->recv[FIRSTSOCKET] = Curl_recv_plain;
  conn->send[FIRSTSOCKET] = Curl_send_plain;
  conn->recv[SECONDARYSOCKET] = Curl_recv_plain;
  conn->send[SECONDARYSOCKET] = Curl_send_plain;

  conn->bits.tcp_fastopen = data->set.tcp_fastopen;

  /***********************************************************************
   * file: is a special case in that it doesn't need a network connection
   ***********************************************************************/
#ifndef CURL_DISABLE_FILE
  if(conn->handler->flags & PROTOPT_NONETWORK) {
    bool done;
    /* this is supposed to be the connect function so we better at least check
       that the file is present here! */
    DEBUGASSERT(conn->handler->connect_it);
    Curl_persistconninfo(conn);
    result = conn->handler->connect_it(conn, &done);

    /* Setup a "faked" transfer that'll do nothing */
    if(!result) {
      conn->bits.tcpconnect[FIRSTSOCKET] = TRUE; /* we are "connected */

      result = Curl_conncache_add_conn(data->state.conn_cache, conn);
      if(result)
        goto out;

      /*
       * Setup whatever necessary for a resumed transfer
       */
      result = setup_range(data);
      if(result) {
        DEBUGASSERT(conn->handler->done);
        /* we ignore the return code for the protocol-specific DONE */
        (void)conn->handler->done(conn, result, FALSE);
        goto out;
      }
      Curl_attach_connnection(data, conn);
      Curl_setup_transfer(data, -1, -1, FALSE, -1);
    }

    /* since we skip do_init() */
    Curl_init_do(data, conn);

    goto out;
  }
#endif

  /* Get a cloned copy of the SSL config situation stored in the
     connection struct. But to get this going nicely, we must first make
     sure that the strings in the master copy are pointing to the correct
     strings in the session handle strings array!

     Keep in mind that the pointers in the master copy are pointing to strings
     that will be freed as part of the Curl_easy struct, but all cloned
     copies will be separately allocated.
  */
  data->set.ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_ORIG];
  data->set.proxy_ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_PROXY];
  data->set.ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_ORIG];
  data->set.proxy_ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_PROXY];
  data->set.ssl.primary.random_file = data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.proxy_ssl.primary.random_file =
    data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.proxy_ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_ORIG];
  data->set.proxy_ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_PROXY];
  data->set.ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST_ORIG];
  data->set.proxy_ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST_PROXY];

  data->set.ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_ORIG];
  data->set.proxy_ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_PROXY];
  data->set.ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_ORIG];
  data->set.proxy_ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_PROXY];
  data->set.ssl.cert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.cert = data->set.str[STRING_CERT_PROXY];
  data->set.ssl.cert_type = data->set.str[STRING_CERT_TYPE_ORIG];
  data->set.proxy_ssl.cert_type = data->set.str[STRING_CERT_TYPE_PROXY];
  data->set.ssl.key = data->set.str[STRING_KEY_ORIG];
  data->set.proxy_ssl.key = data->set.str[STRING_KEY_PROXY];
  data->set.ssl.key_type = data->set.str[STRING_KEY_TYPE_ORIG];
  data->set.proxy_ssl.key_type = data->set.str[STRING_KEY_TYPE_PROXY];
  data->set.ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_ORIG];
  data->set.proxy_ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_PROXY];
  data->set.ssl.primary.clientcert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.primary.clientcert = data->set.str[STRING_CERT_PROXY];
#ifdef USE_TLS_SRP
  data->set.ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_ORIG];
  data->set.proxy_ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_PROXY];
  data->set.ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_ORIG];
  data->set.proxy_ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_PROXY];
#endif

  if(!Curl_clone_primary_ssl_config(&data->set.ssl.primary,
     &conn->ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  if(!Curl_clone_primary_ssl_config(&data->set.proxy_ssl.primary,
                                    &conn->proxy_ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  prune_dead_connections(data);

  /*************************************************************
   * Check the current list of connections to see if we can
   * re-use an already existing one or if we have to create a
   * new one.
   *************************************************************/

  DEBUGASSERT(conn->user);
  DEBUGASSERT(conn->passwd);

  /* reuse_fresh is TRUE if we are told to use a new connection by force, but
     we only acknowledge this option if this is not a re-used connection
     already (which happens due to follow-location or during a HTTP
     authentication phase). CONNECT_ONLY transfers also refuse reuse. */
  if((data->set.reuse_fresh && !data->state.this_is_a_follow) ||
     data->set.connect_only)
    reuse = FALSE;
  else
    reuse = ConnectionExists(data, conn, &conn_temp, &force_reuse, &waitpipe);

  /* If we found a reusable connection that is now marked as in use, we may
     still want to open a new connection if we are multiplexing. */
  if(reuse && !force_reuse && IsMultiplexingPossible(data, conn_temp)) {
    size_t multiplexed = CONN_INUSE(conn_temp);
    if(multiplexed > 0) {
      infof(data, "Found connection %ld, with %zu requests on it\n",
            conn_temp->connection_id, multiplexed);

      if(Curl_conncache_bundle_size(conn_temp) < max_host_connections &&
         Curl_conncache_size(data) < max_total_connections) {
        /* We want a new connection anyway */
        reuse = FALSE;

        infof(data, "We can reuse, but we want a new connection anyway\n");
        Curl_conncache_return_conn(conn_temp);
      }
    }
  }

  if(reuse) {
    /*
     * We already have a connection for this, we got the former connection
     * in the conn_temp variable and thus we need to cleanup the one we
     * just allocated before we can move along and use the previously
     * existing one.
     */
    reuse_conn(conn, conn_temp);
#ifdef USE_SSL
    free(conn->ssl_extra);
#endif
    free(conn);          /* we don't need this anymore */
    conn = conn_temp;
    *in_connect = conn;

    infof(data, "Re-using existing connection! (#%ld) with %s %s\n",
          conn->connection_id,
          conn->bits.proxy?"proxy":"host",
          conn->socks_proxy.host.name ? conn->socks_proxy.host.dispname :
          conn->http_proxy.host.name ? conn->http_proxy.host.dispname :
                                       conn->host.dispname);
  }
  else {
    /* We have decided that we want a new connection. However, we may not
       be able to do that if we have reached the limit of how many
       connections we are allowed to open. */

    if(conn->handler->flags & PROTOPT_ALPN_NPN) {
      /* The protocol wants it, so set the bits if enabled in the easy handle
         (default) */
      if(data->set.ssl_enable_alpn)
        conn->bits.tls_enable_alpn = TRUE;
      if(data->set.ssl_enable_npn)
        conn->bits.tls_enable_npn = TRUE;
    }

    if(waitpipe)
      /* There is a connection that *might* become usable for multiplexing
         "soon", and we wait for that */
      connections_available = FALSE;
    else {
      /* this gets a lock on the conncache */
      struct connectbundle *bundle =
        Curl_conncache_find_bundle(conn, data->state.conn_cache);

      if(max_host_connections > 0 && bundle &&
         (bundle->num_connections >= max_host_connections)) {
        struct connectdata *conn_candidate;

        /* The bundle is full. Extract the oldest connection. */
        conn_candidate = Curl_conncache_extract_bundle(data, bundle);
        Curl_conncache_unlock(data);

        if(conn_candidate)
          (void)Curl_disconnect(data, conn_candidate,
                                /* dead_connection */ FALSE);
        else {
          infof(data, "No more connections allowed to host: %zu\n",
                max_host_connections);
          connections_available = FALSE;
        }
      }
      else
        Curl_conncache_unlock(data);

    }

    if(connections_available &&
       (max_total_connections > 0) &&
       (Curl_conncache_size(data) >= max_total_connections)) {
      struct connectdata *conn_candidate;

      /* The cache is full. Let's see if we can kill a connection. */
      conn_candidate = Curl_conncache_extract_oldest(data);
      if(conn_candidate)
        (void)Curl_disconnect(data, conn_candidate,
                              /* dead_connection */ FALSE);
      else {
        infof(data, "No connections available in cache\n");
        connections_available = FALSE;
      }
    }

    if(!connections_available) {
      infof(data, "No connections available.\n");

      conn_free(conn);
      *in_connect = NULL;

      result = CURLE_NO_CONNECTION_AVAILABLE;
      goto out;
    }
    else {
      /*
       * This is a brand new connection, so let's store it in the connection
       * cache of ours!
       */
      result = Curl_conncache_add_conn(data->state.conn_cache, conn);
      if(result)
        goto out;
    }

#if defined(USE_NTLM)
    /* If NTLM is requested in a part of this connection, make sure we don't
       assume the state is fine as this is a fresh connection and NTLM is
       connection based. */
    if((data->state.authhost.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authhost.done) {
      infof(data, "NTLM picked AND auth done set, clear picked!\n");
      data->state.authhost.picked = CURLAUTH_NONE;
      data->state.authhost.done = FALSE;
    }

    if((data->state.authproxy.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authproxy.done) {
      infof(data, "NTLM-proxy picked AND auth done set, clear picked!\n");
      data->state.authproxy.picked = CURLAUTH_NONE;
      data->state.authproxy.done = FALSE;
    }
#endif
  }

  /* Setup and init stuff before DO starts, in preparing for the transfer. */
  Curl_init_do(data, conn);

  /*
   * Setup whatever necessary for a resumed transfer
   */
  result = setup_range(data);
  if(result)
    goto out;

  /* Continue connectdata initialization here. */

  /*
   * Inherit the proper values from the urldata struct AFTER we have arranged
   * the persistent connection stuff
   */
  conn->seek_func = data->set.seek_func;
  conn->seek_client = data->set.seek_client;

  /*************************************************************
   * Resolve the address of the server or proxy
   *************************************************************/
  result = resolve_server(data, conn, async);

  /* Strip trailing dots. resolve_server copied the name. */
  strip_trailing_dot(&conn->host);
  if(conn->bits.httpproxy)
    strip_trailing_dot(&conn->http_proxy.host);
  if(conn->bits.socksproxy)
    strip_trailing_dot(&conn->socks_proxy.host);
  if(conn->bits.conn_to_host)
    strip_trailing_dot(&conn->conn_to_host);

out:
  return result;
}